

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_ReverseKnotVector(int order,int cv_count,double *knot)

{
  double dVar1;
  long lVar2;
  long lVar3;
  
  if ((1 < order) && (knot != (double *)0x0 && order <= cv_count)) {
    lVar2 = (long)(order + cv_count + -3);
    for (lVar3 = 0; lVar3 <= lVar2; lVar3 = lVar3 + 1) {
      dVar1 = knot[lVar3];
      knot[lVar3] = -knot[lVar2];
      knot[lVar2] = -dVar1;
      lVar2 = lVar2 + -1;
    }
    return true;
  }
  return false;
}

Assistant:

bool ON_ReverseKnotVector(
       int order,
       int cv_count,
       double* knot
       )
{
  if ( order < 2 || cv_count < order || knot == nullptr )
    return false;
  const int knot_count = (order+cv_count-2);
  double t;
  int i, j;
  for ( i = 0, j = knot_count-1; i <= j; i++, j-- ) {
    t = knot[i];
    knot[i] = -knot[j];
    knot[j] = -t;
  }
  return true;
}